

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveSelectStep(Walker *pWalker,Select *p)

{
  Parse *pParse;
  sqlite3 *psVar1;
  Select *pSVar2;
  char *pcVar3;
  ExprList *pOrderBy;
  undefined8 uVar4;
  int iVar5;
  SrcList *pSVar6;
  int iVar7;
  ushort uVar8;
  long lVar9;
  char *pcVar10;
  NameContext *pNVar11;
  long lVar12;
  ExprList_item *pEVar13;
  Select *pSelect;
  NameContext sNC;
  NameContext local_b8;
  ulong local_80;
  Select *local_78;
  NameContext *local_70;
  Select *local_68;
  Walker local_60;
  
  iVar7 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pNVar11 = (pWalker->u).pNC;
    psVar1 = pParse->db;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pNVar11);
      iVar7 = 2;
      if (pParse->nErr == 0) {
        iVar7 = 2 - (uint)(psVar1->mallocFailed == '\0');
      }
    }
    else {
      local_78 = p->pPrior;
      if (p != (Select *)0x0) {
        local_80 = 0;
        pSelect = p;
        local_70 = pNVar11;
        local_68 = p;
        do {
          *(byte *)&pSelect->selFlags = (byte)pSelect->selFlags | 4;
          local_b8.pSrcList = (SrcList *)0x0;
          local_b8.nRef = 0;
          local_b8.nErr = 0;
          local_b8.ncFlags = 0;
          local_b8._42_6_ = 0;
          local_b8.uNC.pEList = (ExprList *)0x0;
          local_b8.pNext = (NameContext *)0x0;
          local_b8.pParse = pParse;
          local_b8.pWinSelect = pSelect;
          iVar7 = sqlite3ResolveExprNames(&local_b8,pSelect->pLimit);
          if (iVar7 != 0) {
            return 2;
          }
          if ((pSelect->selFlags & 0x10000) != 0) {
            (pSelect->pSrc->a[0].pSelect)->pOrderBy = pSelect->pOrderBy;
            pSelect->pOrderBy = (ExprList *)0x0;
          }
          pSVar6 = pSelect->pSrc;
          if (0 < pSVar6->nSrc) {
            lVar12 = 0;
            do {
              pSVar2 = pSVar6->a[lVar12].pSelect;
              if (pSVar2 != (Select *)0x0) {
                iVar7 = 0;
                for (; pNVar11 != (NameContext *)0x0; pNVar11 = pNVar11->pNext) {
                  iVar7 = iVar7 + pNVar11->nRef;
                }
                pcVar10 = pParse->zAuthContext;
                pcVar3 = pSVar6->a[lVar12].zName;
                if (pcVar3 != (char *)0x0) {
                  pParse->zAuthContext = pcVar3;
                }
                local_60.xExprCallback = resolveExprStep;
                local_60.xSelectCallback = resolveSelectStep;
                local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
                local_60.u.pNC = local_70;
                local_60.pParse = pParse;
                sqlite3WalkSelect(&local_60,pSVar2);
                pParse->zAuthContext = pcVar10;
                if (pParse->nErr != 0) {
                  return 2;
                }
                pNVar11 = local_70;
                if (psVar1->mallocFailed != '\0') {
                  return 2;
                }
                for (; pNVar11 != (NameContext *)0x0; pNVar11 = pNVar11->pNext) {
                  iVar7 = iVar7 - pNVar11->nRef;
                }
                pSVar6->a[lVar12].fg.field_0x1 =
                     pSVar6->a[lVar12].fg.field_0x1 & 0xf7 | (iVar7 != 0) << 3;
                pNVar11 = local_70;
              }
              lVar12 = lVar12 + 1;
              pSVar6 = pSelect->pSrc;
            } while (lVar12 < pSVar6->nSrc);
          }
          local_b8.ncFlags = 0x4001;
          local_b8.pSrcList = pSVar6;
          local_b8.pNext = pNVar11;
          iVar7 = sqlite3ResolveExprListNames(&local_b8,pSelect->pEList);
          if (iVar7 != 0) {
            return 2;
          }
          uVar8 = local_b8.ncFlags & 0xbfff;
          pOrderBy = pSelect->pGroupBy;
          if ((byte)((byte)((local_b8.ncFlags & 0x10) >> 4) | pOrderBy != (ExprList *)0x0) == 1) {
            pSelect->selFlags = local_b8.ncFlags & 0x1000 | pSelect->selFlags | 8;
          }
          else {
            uVar8 = local_b8.ncFlags & 0xbfee;
          }
          local_b8.ncFlags = uVar8;
          uVar4 = local_b8._40_8_;
          if (pSelect->pHaving != (Expr *)0x0 && pOrderBy == (ExprList *)0x0) {
            pcVar10 = "a GROUP BY clause is required before HAVING";
LAB_0017dff0:
            sqlite3ErrorMsg(pParse,pcVar10);
            return 2;
          }
          local_b8.uNC.pEList = pSelect->pEList;
          local_b8.ncFlags._0_1_ = (undefined1)uVar8;
          local_b8._41_7_ = SUB87(uVar4,1);
          local_b8._40_8_ = CONCAT71(local_b8._41_7_,(undefined1)local_b8.ncFlags) | 0x80;
          iVar7 = sqlite3ResolveExprNames(&local_b8,pSelect->pHaving);
          if (iVar7 != 0) {
            return 2;
          }
          iVar7 = sqlite3ResolveExprNames(&local_b8,pSelect->pWhere);
          if (iVar7 != 0) {
            return 2;
          }
          pSVar6 = pSelect->pSrc;
          if (0 < pSVar6->nSrc) {
            lVar12 = 0x68;
            lVar9 = 0;
            do {
              if (((*(byte *)((long)pSVar6->a + lVar12 + -0x2b) & 4) != 0) &&
                 (iVar7 = sqlite3ResolveExprListNames
                                    (&local_b8,*(ExprList **)((long)pSVar6->a + lVar12 + -8)),
                 iVar7 != 0)) {
                return 2;
              }
              lVar9 = lVar9 + 1;
              pSVar6 = pSelect->pSrc;
              lVar12 = lVar12 + 0x70;
            } while (lVar9 < pSVar6->nSrc);
          }
          local_b8.pNext = (NameContext *)0x0;
          local_b8._40_8_ = local_b8._40_8_ | 0x4001;
          if ((pSelect->selFlags & 0x10000) != 0) {
            pSVar2 = pSVar6->a[0].pSelect;
            pSelect->pOrderBy = pSVar2->pOrderBy;
            pSVar2->pOrderBy = (ExprList *)0x0;
          }
          iVar7 = (int)local_80;
          if ((local_78 == (Select *)0x0 || iVar7 != 0) &&
             (iVar5 = resolveOrderGroupBy(&local_b8,pSelect,pSelect->pOrderBy,"ORDER"), iVar5 != 0))
          {
            return 2;
          }
          if (psVar1->mallocFailed != '\0') {
            return 2;
          }
          local_b8._40_8_ = local_b8._40_8_ & 0xffffffffffffbfff;
          if (pOrderBy != (ExprList *)0x0) {
            iVar5 = resolveOrderGroupBy(&local_b8,pSelect,pOrderBy,"GROUP");
            if (iVar5 != 0) {
              return 2;
            }
            if (psVar1->mallocFailed != '\0') {
              return 2;
            }
            iVar5 = pOrderBy->nExpr;
            if (0 < iVar5) {
              pEVar13 = pOrderBy->a;
              do {
                if ((pEVar13->pExpr->flags & 2) != 0) {
                  pcVar10 = "aggregate functions are not allowed in the GROUP BY clause";
                  goto LAB_0017dff0;
                }
                pEVar13 = pEVar13 + 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != 0);
            }
          }
          pSVar2 = pSelect->pNext;
          if ((pSVar2 != (Select *)0x0) && (pSelect->pEList->nExpr != pSVar2->pEList->nExpr)) {
            sqlite3SelectWrongNumTermsError(pParse,pSVar2);
            return 2;
          }
          pSelect = pSelect->pPrior;
          local_80 = (ulong)(iVar7 + 1);
          p = local_68;
        } while (pSelect != (Select *)0x0);
      }
      if ((local_78 != (Select *)0x0) && (iVar7 = resolveCompoundOrderBy(pParse,p), iVar7 != 0)) {
        return 2;
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */
  

  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return (pParse->nErr || db->mallocFailed) ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    p->selFlags |= SF_Resolved;

    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }
  
    /* Recursively resolve names in all subqueries
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->pSelect ){
        NameContext *pNC;         /* Used to iterate name contexts */
        int nRef = 0;             /* Refcount for pOuterNC and outer contexts */
        const char *zSavedContext = pParse->zAuthContext;

        /* Count the total number of references to pOuterNC and all of its
        ** parent contexts. After resolving references to expressions in
        ** pItem->pSelect, check if this value has changed. If so, then
        ** SELECT statement pItem->pSelect must be correlated. Set the
        ** pItem->fg.isCorrelated flag if this is the case. */
        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef += pNC->nRef;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr || db->mallocFailed ) return WRC_Abort;

        for(pNC=pOuterNC; pNC; pNC=pNC->pNext) nRef -= pNC->nRef;
        assert( pItem->fg.isCorrelated==0 && nRef<=0 );
        pItem->fg.isCorrelated = (nRef!=0);
      }
    }
  
    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;
  
    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* If there are no aggregate functions in the result-set, and no GROUP BY 
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&NC_MinMaxAgg);
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }
  
    /* If a HAVING clause is present, then there must be a GROUP BY clause.
    */
    if( p->pHaving && !pGroupBy ){
      sqlite3ErrorMsg(pParse, "a GROUP BY clause is required before HAVING");
      return WRC_Abort;
    }
  
    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      struct SrcList_item *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg) 
      ){
        return WRC_Abort;
      }
    }

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries 
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from 
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;
  
    /* Resolve the GROUP BY clause.  At the same time, make sure 
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;
    
      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}